

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O1

void __thiscall FreeOpInfoProtos::~FreeOpInfoProtos(FreeOpInfoProtos *this)

{
  ZCC_OpProto *pZVar1;
  ZCC_OpProto *pZVar2;
  size_t i;
  long lVar3;
  
  lVar3 = 0;
  do {
    pZVar2 = ZCC_OpInfo[lVar3].Protos;
    while (pZVar2 != (ZCC_OpProto *)0x0) {
      pZVar1 = pZVar2->Next;
      operator_delete(pZVar2,0x28);
      pZVar2 = pZVar1;
    }
    ZCC_OpInfo[lVar3].Protos = (ZCC_OpProto *)0x0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x3e);
  return;
}

Assistant:

~FreeOpInfoProtos()
	{
		for (size_t i = 0; i < countof(ZCC_OpInfo); ++i)
		{
			ZCC_OpInfo[i].FreeAllProtos();
		}
	}